

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lyd_parser_create_meta
                 (lyd_ctx *lydctx,lyd_node *parent,lyd_meta **meta,lys_module *mod,char *name,
                 size_t name_len,void *value,size_t value_len,ly_bool *dynamic,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node)

{
  uint uVar1;
  int iVar2;
  ly_ctx *plStack_80;
  ly_bool store_only;
  lyd_meta *first;
  char *pcStack_70;
  ly_bool incomplete;
  char *path;
  size_t sStack_60;
  LY_ERR rc;
  size_t name_len_local;
  char *name_local;
  lys_module *mod_local;
  lyd_meta **meta_local;
  lyd_node *parent_local;
  lyd_ctx *lydctx_local;
  
  path._4_4_ = 0;
  pcStack_70 = (char *)0x0;
  plStack_80 = (ly_ctx *)0x0;
  uVar1 = lydctx->parse_opts;
  if ((meta != (lyd_meta **)0x0) && (*meta != (lyd_meta *)0x0)) {
    plStack_80 = (ly_ctx *)*meta;
  }
  sStack_60 = name_len;
  name_len_local = (size_t)name;
  name_local = (char *)mod;
  mod_local = (lys_module *)meta;
  meta_local = (lyd_meta **)parent;
  parent_local = (lyd_node *)lydctx;
  iVar2 = asprintf(&stack0xffffffffffffff90,"/@%s:%.*s",mod->name,name_len & 0xffffffff,name);
  if (iVar2 == -1) {
    ly_log(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0,LY_LLERR,LY_EMEM,
           "Memory allocation failed (%s()).","lyd_parser_create_meta");
    path._4_4_ = LY_EMEM;
  }
  else {
    ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,pcStack_70,(ly_in *)0x0);
    path._4_4_ = lyd_create_meta((lyd_node *)meta_local,(lyd_meta **)mod_local,
                                 (lys_module *)name_local,(char *)name_len_local,sStack_60,
                                 (char *)value,value_len,'\x01',(uVar1 & 0x2010000) == 0x2010000,
                                 dynamic,format,prefix_data,hints,ctx_node,'\0',
                                 (ly_bool *)((long)&first + 7));
    if (((path._4_4_ == LY_SUCCESS) &&
        (((first._7_1_ == '\0' || (((ulong)parent_local->schema & 0x10000) != 0)) ||
         (path._4_4_ = ly_set_add((ly_set *)&parent_local[0x49].priv,mod_local->ctx,'\x01',
                                  (uint32_t *)0x0), path._4_4_ == LY_SUCCESS)))) &&
       (plStack_80 != (ly_ctx *)0x0)) {
      mod_local->ctx = plStack_80;
    }
  }
  ly_log_location_revert(0,0,1,0);
  free(pcStack_70);
  return path._4_4_;
}

Assistant:

LY_ERR
lyd_parser_create_meta(struct lyd_ctx *lydctx, struct lyd_node *parent, struct lyd_meta **meta, const struct lys_module *mod,
        const char *name, size_t name_len, const void *value, size_t value_len, ly_bool *dynamic, LY_VALUE_FORMAT format,
        void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node)
{
    LY_ERR rc = LY_SUCCESS;
    char *path = NULL;
    ly_bool incomplete;
    struct lyd_meta *first = NULL;
    ly_bool store_only = (lydctx->parse_opts & LYD_PARSE_STORE_ONLY) == LYD_PARSE_STORE_ONLY ? 1 : 0;

    if (meta && *meta) {
        /* remember the first metadata */
        first = *meta;
    }

    /* generate path to the metadata */
    if (asprintf(&path, "/@%s:%.*s", mod->name, (int)name_len, name) == -1) {
        LOGMEM(lydctx->data_ctx->ctx);
        rc = LY_EMEM;
        goto cleanup;
    }
    ly_log_location(NULL, NULL, path, NULL);

    LY_CHECK_GOTO(rc = lyd_create_meta(parent, meta, mod, name, name_len, value, value_len, 1, store_only, dynamic, format,
            prefix_data, hints, ctx_node, 0, &incomplete), cleanup);

    if (incomplete && !(lydctx->parse_opts & LYD_PARSE_ONLY)) {
        LY_CHECK_GOTO(rc = ly_set_add(&lydctx->meta_types, *meta, 1, NULL), cleanup);
    }

    if (first) {
        /* always return the first metadata */
        *meta = first;
    }

cleanup:
    ly_log_location_revert(0, 0, 1, 0);
    free(path);
    return rc;
}